

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O3

TestStatus *
vkt::clipping::anon_unknown_0::ClipVolume::testPrimitivesOutside
          (TestStatus *__return_storage_ptr__,Context *context,VkPrimitiveTopology topology)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var1;
  char *__s;
  VkPrimitiveTopology topology_;
  bool bVar2;
  int iVar3;
  const_iterator cVar4;
  size_t sVar5;
  TestStatus *pTVar6;
  bool bVar7;
  long lVar8;
  int iVar9;
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> shaders;
  VulkanProgram vulkanProgram;
  DrawCallData drawCallData;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  VulkanDrawContext drawContext;
  DrawState drawState;
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> local_328;
  Context *local_308;
  VkPrimitiveTopology local_2fc;
  TestStatus *local_2f8;
  TextureFormat local_2f0;
  ProgramBinary *pPStack_2e8;
  int local_2e0;
  int local_2dc [2];
  int local_2d4;
  void *local_2d0;
  TestLog *local_2c8;
  VulkanProgram local_2c0;
  DrawCallData local_2b8;
  undefined1 local_2b0 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_2a8;
  ConstPixelBufferAccess local_290;
  Vec4 local_268;
  Vec4 local_258;
  undefined1 local_240 [8];
  float local_238;
  VkFormat VStack_234;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230 [6];
  ios_base local_1c8 [380];
  DrawState local_4c;
  
  local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
  _M_impl.super__Vector_impl_data._M_finish = (Shader *)0x0;
  local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (Shader *)0x0;
  p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  local_308 = context;
  local_240 = (undefined1  [8])local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"vert","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var1,(key_type *)local_240);
  pPStack_2e8 = *(ProgramBinary **)(cVar4._M_node + 2);
  local_2f0.order = VK_SHADER_STAGE_VERTEX_BIT;
  if (local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
    _M_realloc_insert<vkt::drawutil::Shader>
              (&local_328,
               (iterator)
               local_328.
               super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
               _M_impl.super__Vector_impl_data._M_finish,(Shader *)&local_2f0);
  }
  else {
    (local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
     _M_impl.super__Vector_impl_data._M_finish)->stage = VK_SHADER_STAGE_VERTEX_BIT;
    *(ChannelType *)
     &(local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
       _M_impl.super__Vector_impl_data._M_finish)->field_0x4 = local_2f0.type;
    (local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
     _M_impl.super__Vector_impl_data._M_finish)->binary = pPStack_2e8;
    local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_240 != (undefined1  [8])local_230) {
    operator_delete((void *)local_240,local_230[0]._M_allocated_capacity + 1);
  }
  p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)local_308->m_progCollection;
  local_240 = (undefined1  [8])local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"frag","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var1,(key_type *)local_240);
  pPStack_2e8 = *(ProgramBinary **)(cVar4._M_node + 2);
  local_2f0.order = VK_SHADER_STAGE_FRAGMENT_BIT;
  if (local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
    _M_realloc_insert<vkt::drawutil::Shader>
              (&local_328,
               (iterator)
               local_328.
               super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
               _M_impl.super__Vector_impl_data._M_finish,(Shader *)&local_2f0);
  }
  else {
    (local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
     _M_impl.super__Vector_impl_data._M_finish)->stage = VK_SHADER_STAGE_FRAGMENT_BIT;
    *(ChannelType *)
     &(local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
       _M_impl.super__Vector_impl_data._M_finish)->field_0x4 = local_2f0.type;
    (local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
     _M_impl.super__Vector_impl_data._M_finish)->binary = pPStack_2e8;
    local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_240 != (undefined1  [8])local_230) {
    operator_delete((void *)local_240,local_230[0]._M_allocated_capacity + 1);
  }
  local_2c8 = local_308->m_testCtx->m_log;
  local_240 = (undefined1  [8])local_2c8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
  local_2fc = topology;
  local_2f8 = __return_storage_ptr__;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_238,
             "Drawing primitives outside the clip volume. Expecting an empty image.",0x45);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_240,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
  std::ios_base::~ios_base(local_1c8);
  lVar8 = 0;
  iVar9 = 0;
  bVar2 = true;
  do {
    bVar7 = bVar2;
    local_240 = (undefined1  [8])local_2c8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    __s = testPrimitivesOutside::cases[lVar8].desc;
    if (__s == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_238 +
                      (int)*(undefined8 *)(CONCAT44(VStack_234,local_238) + -0x18));
    }
    else {
      sVar5 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,__s,sVar5);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_240,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
    std::ios_base::~ios_base(local_1c8);
    topology_ = local_2fc;
    local_238 = testPrimitivesOutside::cases[lVar8].zPos;
    local_240 = (undefined1  [8])0x0;
    VStack_234 = VK_FORMAT_UNDEFINED;
    genVertices(&local_2a8,local_2fc,(Vec4 *)local_240,0.0);
    drawutil::DrawState::DrawState(&local_4c,topology_,0x10,0x10);
    local_2c0.shaders = &local_328;
    local_2b8.vertices = &local_2a8;
    drawutil::VulkanDrawContext::VulkanDrawContext
              ((VulkanDrawContext *)local_240,local_308,&local_4c,&local_2b8,&local_2c0);
    drawutil::VulkanDrawContext::draw((VulkanDrawContext *)local_240);
    drawutil::VulkanDrawContext::getColorPixels(&local_290,(VulkanDrawContext *)local_240);
    local_258.m_data[0] = 0.0;
    local_258.m_data[1] = 0.0;
    local_258.m_data[2] = 0.0;
    local_258.m_data[3] = 1.0;
    local_268.m_data[0] = 0.0;
    local_268.m_data[1] = 0.0;
    local_268.m_data[2] = 0.0;
    local_268.m_data[3] = 0.0;
    local_2f0 = local_290.m_format;
    local_2e0 = local_290.m_size.m_data[2];
    pPStack_2e8 = (ProgramBinary *)CONCAT44(local_290.m_size.m_data[1],local_290.m_size.m_data[0]);
    local_2d4 = local_290.m_pitch.m_data[2];
    local_2dc[0] = local_290.m_pitch.m_data[0];
    local_2dc[1] = local_290.m_pitch.m_data[1];
    local_2d0 = local_290.m_data;
    local_2b0._0_4_ = R;
    local_2b0._4_4_ = SNORM_INT8;
    iVar3 = countPixels((anon_unknown_0 *)&local_2f0,(ConstPixelBufferAccess *)local_2b0,
                        (IVec2 *)(ulong)(uint)local_290.m_size.m_data[0],
                        (IVec2 *)(ulong)(uint)local_290.m_size.m_data[1],&local_258,&local_268);
    drawutil::VulkanDrawContext::~VulkanDrawContext((VulkanDrawContext *)local_240);
    if (local_2a8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a8.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_2a8.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a8.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    iVar9 = iVar9 + (uint)(iVar3 == 0x100);
    lVar8 = 1;
    bVar2 = false;
  } while (bVar7);
  local_240 = (undefined1  [8])local_230;
  if (iVar9 == 2) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"OK","");
    pTVar6 = local_2f8;
    local_2f8->m_code = QP_TEST_RESULT_PASS;
    (local_2f8->m_description)._M_dataplus._M_p = (pointer)&(local_2f8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f8->m_description,local_240,
               (char *)((long)local_240 + CONCAT44(VStack_234,local_238)));
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_240,"Rendered image(s) are incorrect","");
    pTVar6 = local_2f8;
    local_2f8->m_code = QP_TEST_RESULT_FAIL;
    (local_2f8->m_description)._M_dataplus._M_p = (pointer)&(local_2f8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f8->m_description,local_240,
               (char *)((long)local_240 + CONCAT44(VStack_234,local_238)));
  }
  if (local_240 != (undefined1  [8])local_230) {
    operator_delete((void *)local_240,local_230[0]._M_allocated_capacity + 1);
  }
  if (local_328.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_328.
                    super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_328.
                          super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.
                          super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar6;
}

Assistant:

tcu::TestStatus testPrimitivesOutside (Context& context, const VkPrimitiveTopology topology)
{
	std::vector<Shader> shaders;
	shaders.push_back(Shader(VK_SHADER_STAGE_VERTEX_BIT,	context.getBinaryCollection().get("vert")));
	shaders.push_back(Shader(VK_SHADER_STAGE_FRAGMENT_BIT,	context.getBinaryCollection().get("frag")));

	tcu::TestLog&	log			= context.getTestContext().getLog();
	int				numPassed	= 0;

	static const struct
	{
		const char* const	desc;
		float				zPos;
	} cases[] =
	{
		{ "Draw primitives in front of the near clipping plane, z < 0.0",	-0.5f, },
		{ "Draw primitives behind the far clipping plane, z > 1.0",			 1.5f, },
	};

	log << tcu::TestLog::Message << "Drawing primitives outside the clip volume. Expecting an empty image." << tcu::TestLog::EndMessage;

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
	{
		log << tcu::TestLog::Message << cases[caseNdx].desc << tcu::TestLog::EndMessage;

		const std::vector<Vec4> vertices = genVertices(topology, Vec4(0.0f, 0.0f, cases[caseNdx].zPos, 0.0f), 0.0f);
		DrawState				drawState		(topology, RENDER_SIZE, RENDER_SIZE);
		DrawCallData			drawCallData	(vertices);
		VulkanProgram			vulkanProgram	(shaders);

		VulkanDrawContext		drawContext(context, drawState, drawCallData, vulkanProgram);
		drawContext.draw();

		// All pixels must be black -- nothing is drawn.
		const int numBlackPixels = countPixels(drawContext.getColorPixels(), Vec4(0.0f, 0.0f, 0.0f, 1.0f), Vec4());
		if (numBlackPixels == NUM_RENDER_PIXELS)
			++numPassed;
	}

	return (numPassed == DE_LENGTH_OF_ARRAY(cases) ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Rendered image(s) are incorrect"));
}